

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_Null_Test::~iu_SyntaxTest_x_iutest_x_Null_Test
          (iu_SyntaxTest_x_iutest_x_Null_Test *this)

{
  iu_SyntaxTest_x_iutest_x_Null_Test *this_local;
  
  ~iu_SyntaxTest_x_iutest_x_Null_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

IUTEST(SyntaxTest, Null)
{
    int* p = NULL;
    if( int x = 1 )
        IUTEST_ASSERT_NULL(p) << x;
    if( int x = 1 )
        IUTEST_EXPECT_NULL(p) << x;
    if( int x = 1 )
        IUTEST_INFORM_NULL(p) << x;
    if( int x = 1 )
        IUTEST_ASSUME_NULL(p) << x;
}